

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

UNumberDecimalSeparatorDisplay
icu_63::number::impl::stem_to_object::decimalSeparatorDisplay(StemEnum stem)

{
  UNumberDecimalSeparatorDisplay UVar1;
  
  UVar1 = UNUM_DECIMAL_SEPARATOR_AUTO;
  if (stem != STEM_DECIMAL_AUTO) {
    UVar1 = (stem != STEM_DECIMAL_ALWAYS) + UNUM_DECIMAL_SEPARATOR_ALWAYS;
  }
  return UVar1;
}

Assistant:

UNumberDecimalSeparatorDisplay stem_to_object::decimalSeparatorDisplay(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_DECIMAL_AUTO:
            return UNUM_DECIMAL_SEPARATOR_AUTO;
        case STEM_DECIMAL_ALWAYS:
            return UNUM_DECIMAL_SEPARATOR_ALWAYS;
        default:
            return UNUM_DECIMAL_SEPARATOR_COUNT; // for objects, throw; for enums, return COUNT
    }
}